

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogFileDaily.cpp
# Opt level: O0

void __thiscall liblogger::LogFileDaily::Log(LogFileDaily *this,LogType Type,string *str)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  ostream *poVar5;
  int *piVar6;
  char *pcVar7;
  undefined8 uVar8;
  FILE *pFVar9;
  undefined8 uVar10;
  LogException *this_00;
  LogType in_ESI;
  long in_RDI;
  stringstream ss_5;
  LogFileDaily *in_stack_00000150;
  stringstream ss_4;
  stringstream ss_3;
  stringstream ss_2;
  stringstream ss_1;
  string cname;
  stringstream ss;
  char buf [128];
  char fname [1024];
  tm timeinfo;
  time_t current;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffef78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffef80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffef88;
  undefined4 in_stack_ffffffffffffef98;
  undefined4 in_stack_ffffffffffffef9c;
  LogException *in_stack_ffffffffffffefa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffefa8;
  stringstream local_f60 [16];
  ostream local_f50 [383];
  undefined1 local_dd1;
  stringstream local_db0 [16];
  ostream local_da0 [383];
  undefined1 local_c21;
  stringstream local_c00 [16];
  ostream local_bf0 [383];
  undefined1 local_a71;
  stringstream local_a50 [16];
  ostream local_a40 [383];
  undefined1 local_8c1;
  stringstream local_8a0 [16];
  ostream local_890 [376];
  string local_718 [32];
  string local_6f8 [32];
  string local_6d8 [32];
  string local_6b8 [39];
  undefined1 local_691;
  stringstream local_660 [16];
  ostream local_650 [376];
  char local_4d8 [128];
  char local_458 [1024];
  tm local_58;
  time_t local_20 [2];
  LogType local_c;
  
  local_c = in_ESI;
  local_20[0] = time((time_t *)0x0);
  localtime_r(local_20,&local_58);
  sVar4 = strftime(local_458,0x400,"%Y%m%d",&local_58);
  if (sVar4 == 0) {
    std::__cxx11::stringstream::stringstream(local_660);
    poVar5 = std::operator<<(local_650,"strftime failed: \'");
    poVar5 = std::operator<<(poVar5,"\' error: ");
    piVar6 = __errno_location();
    pcVar7 = strerror(*piVar6);
    std::operator<<(poVar5,pcVar7);
    local_691 = 1;
    uVar8 = __cxa_allocate_exception(0x28);
    std::__cxx11::stringstream::str();
    LogException::LogException
              (in_stack_ffffffffffffefa0,
               (string *)CONCAT44(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98));
    local_691 = 0;
    __cxa_throw(uVar8,&LogException::typeinfo,LogException::~LogException);
  }
  std::operator+(in_stack_ffffffffffffefa8,(char *)in_stack_ffffffffffffefa0);
  std::operator+(in_stack_ffffffffffffef88,in_stack_ffffffffffffef80);
  std::operator+(in_stack_ffffffffffffef88,(char *)in_stack_ffffffffffffef80);
  std::operator+(in_stack_ffffffffffffef88,(char *)in_stack_ffffffffffffef80);
  std::__cxx11::string::~string(local_6d8);
  std::__cxx11::string::~string(local_6f8);
  std::__cxx11::string::~string(local_718);
  bVar1 = std::operator!=(in_stack_ffffffffffffef80,in_stack_ffffffffffffef78);
  if (bVar1) {
    if (*(long *)(in_RDI + 0x70) != 0) {
      iVar3 = fclose(*(FILE **)(in_RDI + 0x70));
      if (iVar3 < 0) {
        std::__cxx11::stringstream::stringstream(local_8a0);
        poVar5 = std::operator<<(local_890,"Cannot close file: \'");
        poVar5 = std::operator<<(poVar5,(string *)(in_RDI + 0x50));
        poVar5 = std::operator<<(poVar5,"\' error: ");
        piVar6 = __errno_location();
        pcVar7 = strerror(*piVar6);
        std::operator<<(poVar5,pcVar7);
        local_8c1 = 1;
        uVar8 = __cxa_allocate_exception(0x28);
        std::__cxx11::stringstream::str();
        LogException::LogException
                  (in_stack_ffffffffffffefa0,
                   (string *)CONCAT44(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98));
        local_8c1 = 0;
        __cxa_throw(uVar8,&LogException::typeinfo,LogException::~LogException);
      }
      *(undefined8 *)(in_RDI + 0x70) = 0;
    }
    std::__cxx11::string::operator=((string *)(in_RDI + 0x50),local_6b8);
    RemoveOld(in_stack_00000150);
  }
  if (*(long *)(in_RDI + 0x70) == 0) {
    pcVar7 = (char *)std::__cxx11::string::c_str();
    pFVar9 = fopen(pcVar7,"a");
    *(FILE **)(in_RDI + 0x70) = pFVar9;
    if (*(long *)(in_RDI + 0x70) == 0) {
      std::__cxx11::stringstream::stringstream(local_a50);
      poVar5 = std::operator<<(local_a40,"Cannot open file: \'");
      poVar5 = std::operator<<(poVar5,(string *)(in_RDI + 0x50));
      poVar5 = std::operator<<(poVar5,"\' error: ");
      piVar6 = __errno_location();
      pcVar7 = strerror(*piVar6);
      std::operator<<(poVar5,pcVar7);
      local_a71 = 1;
      uVar8 = __cxa_allocate_exception(0x28);
      std::__cxx11::stringstream::str();
      LogException::LogException
                (in_stack_ffffffffffffefa0,
                 (string *)CONCAT44(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98));
      local_a71 = 0;
      __cxa_throw(uVar8,&LogException::typeinfo,LogException::~LogException);
    }
  }
  sVar4 = strftime(local_4d8,0x80,"%F %T",&local_58);
  if (sVar4 == 0) {
    std::__cxx11::stringstream::stringstream(local_c00);
    poVar5 = std::operator<<(local_bf0,"strftime failed: \'");
    poVar5 = std::operator<<(poVar5,"\' error: ");
    piVar6 = __errno_location();
    pcVar7 = strerror(*piVar6);
    std::operator<<(poVar5,pcVar7);
    local_c21 = 1;
    uVar8 = __cxa_allocate_exception(0x28);
    std::__cxx11::stringstream::str();
    LogException::LogException
              (in_stack_ffffffffffffefa0,
               (string *)CONCAT44(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98));
    local_c21 = 0;
    __cxa_throw(uVar8,&LogException::typeinfo,LogException::~LogException);
  }
  pFVar9 = *(FILE **)(in_RDI + 0x70);
  LogTypeToStr_abi_cxx11_(local_c);
  uVar8 = std::__cxx11::string::c_str();
  uVar2 = getpid();
  uVar10 = std::__cxx11::string::c_str();
  iVar3 = fprintf(pFVar9,"%s - %s [PID: %d] - %s\n",local_4d8,uVar8,(ulong)uVar2,uVar10);
  if (iVar3 < 0) {
    std::__cxx11::stringstream::stringstream(local_db0);
    poVar5 = std::operator<<(local_da0,"failed to write to file \'");
    poVar5 = std::operator<<(poVar5,(string *)(in_RDI + 0x50));
    poVar5 = std::operator<<(poVar5,"\' error:");
    piVar6 = __errno_location();
    pcVar7 = strerror(*piVar6);
    std::operator<<(poVar5,pcVar7);
    local_dd1 = 1;
    this_00 = (LogException *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringstream::str();
    LogException::LogException
              (this_00,(string *)CONCAT44(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98));
    local_dd1 = 0;
    __cxa_throw(this_00,&LogException::typeinfo,LogException::~LogException);
  }
  iVar3 = fflush(*(FILE **)(in_RDI + 0x70));
  if (-1 < iVar3) {
    std::__cxx11::string::~string(local_6b8);
    return;
  }
  std::__cxx11::stringstream::stringstream(local_f60);
  poVar5 = std::operator<<(local_f50,"failed to fflush to file \'");
  poVar5 = std::operator<<(poVar5,(string *)(in_RDI + 0x50));
  poVar5 = std::operator<<(poVar5,"\' error:");
  piVar6 = __errno_location();
  pcVar7 = strerror(*piVar6);
  std::operator<<(poVar5,pcVar7);
  uVar8 = __cxa_allocate_exception(0x28);
  std::__cxx11::stringstream::str();
  LogException::LogException
            (in_stack_ffffffffffffefa0,(string *)CONCAT44(iVar3,in_stack_ffffffffffffef98));
  __cxa_throw(uVar8,&LogException::typeinfo,LogException::~LogException);
}

Assistant:

void LogFileDaily::Log(const LogType Type, const std::string &str)
{
	time_t current = time(NULL);
	struct tm timeinfo;
	char fname[1024];
	char buf[128];

	localtime_r(&current, &timeinfo);

	if (strftime(fname, sizeof(fname), "%Y%m%d", &timeinfo) == 0)
	{
		std::stringstream ss;
		ss << "strftime failed: '" << "' error: " << strerror(errno);
		throw(LogException(ss.str()));
	}
	const std::string cname = m_dir + "/" + m_prefix + "-" + fname;

	if (m_fname != cname)
	{
		if (m_fp != NULL)
		{
			if (fclose(m_fp) < 0)
			{
				std::stringstream ss;
				ss << "Cannot close file: '" << m_fname << "' error: " << strerror(errno);
				throw(LogException(ss.str()));
			}
			m_fp = NULL;
		}
		m_fname = cname;
		RemoveOld();
	}

	if (m_fp == NULL)
	{
		m_fp = fopen(m_fname.c_str(), "a");
		if (m_fp == NULL)
		{
			std::stringstream ss;
			ss << "Cannot open file: '" << m_fname << "' error: " << strerror(errno);
			throw(LogException(ss.str()));
		}
	}

	if (strftime(buf, sizeof(buf), "%F %T", &timeinfo) == 0)
	{
		std::stringstream ss;
		ss << "strftime failed: '" << "' error: " << strerror(errno);
		throw(LogException(ss.str()));
	}

	if (fprintf(m_fp, "%s - %s [PID: %d] - %s\n", buf, LogTypeToStr(Type).c_str(), getpid(), str.c_str()) < 0)
	{
		std::stringstream ss;
		ss << "failed to write to file '" << m_fname << "' error:" << strerror(errno);
		throw(LogException(ss.str()));
	}
	if (fflush(m_fp) < 0)
	{
		std::stringstream ss;
		ss << "failed to fflush to file '" << m_fname << "' error:" << strerror(errno);
		throw(LogException(ss.str()));
	}
}